

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsortfilterproxymodel.cpp
# Opt level: O2

void __thiscall
QSortFilterProxyModelPrivate::_q_sourceColumnsInserted
          (QSortFilterProxyModelPrivate *this,QModelIndex *source_parent,int start,int end)

{
  int iVar1;
  QObject *pQVar2;
  QAbstractItemModel *pQVar3;
  bool bVar4;
  parameter_type pVar5;
  long in_FS_OFFSET;
  undefined1 local_60 [24];
  undefined1 local_48 [4];
  int local_44;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->super_QAbstractProxyModelPrivate).super_QAbstractItemModelPrivate.
           super_QObjectPrivate.super_QObjectData.q_ptr;
  source_items_inserted(this,source_parent,start,end,Columns);
  bVar4 = QModelIndex::isValid(source_parent);
  if (!bVar4) {
    iVar1 = this->source_sort_column;
    if (iVar1 == -1) {
      bVar4 = update_source_sort_column(this);
      if (bVar4) {
        pVar5 = QObjectCompatProperty<QSortFilterProxyModelPrivate,_bool,_&QSortFilterProxyModelPrivate::_qt_property_dynamic_sortfilter_offset,_&QSortFilterProxyModelPrivate::setDynamicSortFilterForwarder,_nullptr,_nullptr>
                ::value(&this->dynamic_sortfilter);
        if (pVar5) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
            sort(this);
            return;
          }
          goto LAB_0041cc6b;
        }
      }
    }
    else {
      if (start <= iVar1) {
        this->source_sort_column = iVar1 + (end - start) + 1;
      }
      QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
      ::value(&(this->super_QAbstractProxyModelPrivate).model);
      pQVar3 = (this->super_QAbstractProxyModelPrivate).model.
               super_QPropertyData<QAbstractItemModel_*>.val;
      (*(pQVar3->super_QObject)._vptr_QObject[0xc])
                (local_60,pQVar3,0,(ulong)(uint)this->source_sort_column,source_parent);
      (*pQVar2->_vptr_QObject[0x33])(local_48,pQVar2,local_60);
      this->proxy_sort_column = local_44;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_0041cc6b:
  __stack_chk_fail();
}

Assistant:

void QSortFilterProxyModelPrivate::_q_sourceColumnsInserted(
    const QModelIndex &source_parent, int start, int end)
{
    Q_Q(const QSortFilterProxyModel);
    source_items_inserted(source_parent, start, end, Direction::Columns);

    if (source_parent.isValid())
        return; //we sort according to the root column only
    if (source_sort_column == -1) {
        //we update the source_sort_column depending on the proxy_sort_column
        if (update_source_sort_column() && dynamic_sortfilter)
            sort();
    } else {
        if (start <= source_sort_column)
            source_sort_column += end - start + 1;

        proxy_sort_column = q->mapFromSource(model->index(0,source_sort_column, source_parent)).column();
    }
}